

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O1

stale_header_info fdb_get_smallest_active_header(fdb_kvs_handle *handle)

{
  avl_node **__lock;
  filemgr *pfVar1;
  long lVar2;
  char *bid;
  void *pvVar3;
  avl_node *paVar4;
  avl_node *paVar5;
  avl_node *paVar6;
  avl_node *paVar7;
  ulong uVar8;
  fdb_kvs_handle *pfVar9;
  ulong uVar10;
  avl_node *bid_00;
  stale_header_info sVar11;
  long alStack_d0 [9];
  bid_t local_88;
  uint64_t dummy64;
  char *new_filename;
  bid_t last_wal_bid;
  fdb_kvs_handle *local_68;
  void *local_60;
  avl_node *local_58;
  uint64_t local_50;
  filemgr_magic_t magic;
  fdb_seqnum_t seqnum;
  size_t hdr_len;
  
  lVar2 = -((ulong)(handle->config).blocksize + 0xf & 0xfffffffffffffff0);
  local_60 = (void *)((long)&local_88 + lVar2);
  paVar7 = (avl_node *)
           (handle->fhandle->root->cur_header_revnum).super___atomic_base<unsigned_long>._M_i;
  bid_00 = (avl_node *)(handle->fhandle->root->last_hdr_bid).super___atomic_base<unsigned_long>._M_i
  ;
  pfVar1 = handle->file;
  *(undefined8 *)((long)alStack_d0 + lVar2 + 0x40) = 0x135d45;
  pthread_spin_lock(&pfVar1->fhandle_idx_lock);
  pfVar1 = handle->file;
  local_68 = handle;
  *(undefined8 *)((long)alStack_d0 + lVar2 + 0x40) = 0x135d57;
  paVar4 = avl_first(&pfVar1->fhandle_idx);
  local_58 = paVar7;
  pfVar9 = local_68;
  while (local_68 = pfVar9, paVar4 != (avl_node *)0x0) {
    *(undefined8 *)((long)alStack_d0 + lVar2 + 0x40) = 0x135d6e;
    paVar5 = avl_next(paVar4);
    paVar4 = paVar4[-1].right;
    __lock = &paVar4[1].left;
    *(undefined8 *)((long)alStack_d0 + lVar2 + 0x40) = 0x135d81;
    pthread_spin_lock((pthread_spinlock_t *)__lock);
    paVar4 = paVar4->left->parent;
    while (paVar6 = paVar4, paVar6 != (avl_node *)0x0) {
      paVar4 = paVar6->left;
      if ((paVar6[-1].right[0x11].right != (avl_node *)0x0) &&
         (paVar6[-1].right[0x10].parent < paVar7)) {
        paVar7 = paVar6[-1].right[0x10].parent;
        bid_00 = paVar6[-1].right[0x10].right;
      }
    }
    *(undefined8 *)((long)alStack_d0 + lVar2 + 0x40) = 0x135dce;
    pthread_spin_unlock((pthread_spinlock_t *)__lock);
    paVar4 = paVar5;
    pfVar9 = local_68;
  }
  pfVar1 = pfVar9->file;
  *(undefined8 *)((long)alStack_d0 + lVar2 + 0x40) = 0x135de5;
  pthread_spin_unlock(&pfVar1->fhandle_idx_lock);
  pvVar3 = local_60;
  last_wal_bid = (pfVar9->file->config->num_keeping_headers).super___atomic_base<unsigned_long>._M_i
  ;
  if ((avl_node *)last_wal_bid != (avl_node *)0x0) {
    paVar4 = bid_00;
    if (bid_00 == (avl_node *)(pfVar9->last_hdr_bid).super___atomic_base<unsigned_long>._M_i) {
      paVar4 = (avl_node *)(pfVar9->file->header).bid.super___atomic_base<unsigned_long>._M_i;
      paVar7 = (avl_node *)((pfVar9->file->header).revnum - 1);
    }
    hdr_len = (size_t)paVar7;
    local_58 = (avl_node *)((long)local_58 - (long)paVar7);
    uVar10 = 0;
    if (local_58 <= last_wal_bid) {
      uVar10 = last_wal_bid - (long)local_58;
    }
    if (local_58 <= last_wal_bid && last_wal_bid - (long)local_58 != 0) {
      pfVar1 = pfVar9->file;
      *(err_log_callback **)((long)alStack_d0 + lVar2 + 0x40) = &pfVar9->log_callback;
      *(undefined8 *)((long)alStack_d0 + lVar2 + 0x38) = 0;
      *(uint64_t **)((long)alStack_d0 + lVar2 + 0x30) = &local_50;
      *(undefined8 *)((long)alStack_d0 + lVar2 + 0x28) = 0;
      *(undefined8 *)((long)alStack_d0 + lVar2 + 0x20) = 0x135e7e;
      paVar4 = (avl_node *)
               filemgr_fetch_prev_header
                         (pfVar1,(uint64_t)paVar4,pvVar3,&seqnum,&magic,&hdr_len,
                          *(uint64_t **)((long)alStack_d0 + lVar2 + 0x28),
                          *(uint64_t **)((long)alStack_d0 + lVar2 + 0x30),
                          *(uint64_t **)((long)alStack_d0 + lVar2 + 0x38),
                          *(err_log_callback **)((long)alStack_d0 + lVar2 + 0x40));
      if (seqnum != 0) {
        uVar8 = 0;
        do {
          bid_00 = paVar4;
          pvVar3 = local_60;
          uVar8 = uVar8 + 1;
          paVar4 = bid_00;
          if (uVar10 <= uVar8) break;
          pfVar1 = local_68->file;
          *(err_log_callback **)((long)alStack_d0 + lVar2 + 0x40) = &pfVar9->log_callback;
          *(undefined8 *)((long)alStack_d0 + lVar2 + 0x38) = 0;
          *(uint64_t **)((long)alStack_d0 + lVar2 + 0x30) = &local_50;
          *(undefined8 *)((long)alStack_d0 + lVar2 + 0x28) = 0;
          *(undefined8 *)((long)alStack_d0 + lVar2 + 0x20) = 0x135ec3;
          paVar4 = (avl_node *)
                   filemgr_fetch_prev_header
                             (pfVar1,(uint64_t)bid_00,pvVar3,&seqnum,&magic,&hdr_len,
                              *(uint64_t **)((long)alStack_d0 + lVar2 + 0x28),
                              *(uint64_t **)((long)alStack_d0 + lVar2 + 0x30),
                              *(uint64_t **)((long)alStack_d0 + lVar2 + 0x38),
                              *(err_log_callback **)((long)alStack_d0 + lVar2 + 0x40));
        } while (seqnum != 0);
      }
    }
    pfVar9 = local_68;
    if (last_wal_bid <= local_58) {
      bid_00 = paVar4;
    }
  }
  pvVar3 = local_60;
  pfVar1 = pfVar9->file;
  if (bid_00 == (avl_node *)(pfVar9->last_hdr_bid).super___atomic_base<unsigned_long>._M_i) {
    *(undefined8 *)((long)alStack_d0 + lVar2 + 0x40) = 0x135f12;
    filemgr_get_header(pfVar1,pvVar3,&seqnum,(bid_t *)0x0,&magic,&hdr_len);
    if (seqnum == 0) {
      new_filename = (char *)0xffffffffffffffff;
      hdr_len = 0;
      goto LAB_00135fd0;
    }
  }
  else {
    *(err_log_callback **)((long)alStack_d0 + lVar2 + 0x40) = &pfVar9->log_callback;
    *(undefined8 *)((long)alStack_d0 + lVar2 + 0x38) = 0;
    *(uint64_t **)((long)alStack_d0 + lVar2 + 0x30) = &local_50;
    *(undefined8 *)((long)alStack_d0 + lVar2 + 0x28) = 0;
    *(undefined8 *)((long)alStack_d0 + lVar2 + 0x20) = 0x135f50;
    filemgr_fetch_header
              (pfVar1,(uint64_t)bid_00,pvVar3,&seqnum,&magic,&hdr_len,
               *(uint64_t **)((long)alStack_d0 + lVar2 + 0x28),
               *(uint64_t **)((long)alStack_d0 + lVar2 + 0x30),
               *(uint64_t **)((long)alStack_d0 + lVar2 + 0x38),
               *(err_log_callback **)((long)alStack_d0 + lVar2 + 0x40));
  }
  *(undefined8 *)((long)alStack_d0 + lVar2 + 0x40) = 0;
  *(uint64_t **)((long)alStack_d0 + lVar2 + 0x38) = &dummy64;
  *(bid_t **)((long)alStack_d0 + lVar2 + 0x30) = &local_88;
  *(bid_t **)((long)alStack_d0 + lVar2 + 0x28) = &local_88;
  *(char ***)((long)alStack_d0 + lVar2 + 0x20) = &new_filename;
  *(bid_t **)((long)alStack_d0 + lVar2 + 0x18) = &local_88;
  *(bid_t **)((long)alStack_d0 + lVar2 + 0x10) = &local_88;
  *(bid_t **)((long)alStack_d0 + lVar2 + 8) = &local_88;
  *(undefined8 *)((long)alStack_d0 + lVar2) = 0x135f7e;
  fdb_fetch_header(local_50,pvVar3,&local_88,&local_88,&local_88,&local_88,
                   *(uint64_t **)((long)alStack_d0 + lVar2 + 8),
                   *(uint64_t **)((long)alStack_d0 + lVar2 + 0x10),
                   *(uint64_t **)((long)alStack_d0 + lVar2 + 0x18),
                   *(uint64_t **)((long)alStack_d0 + lVar2 + 0x20),
                   *(uint64_t **)((long)alStack_d0 + lVar2 + 0x28),
                   *(uint64_t **)((long)alStack_d0 + lVar2 + 0x30),
                   *(char ***)((long)alStack_d0 + lVar2 + 0x38),
                   *(char ***)((long)alStack_d0 + lVar2 + 0x40));
  bid = new_filename;
  if (new_filename == (char *)0xffffffffffffffff) {
    new_filename = (char *)0xffffffffffffffff;
    hdr_len = 0;
  }
  else {
    pfVar1 = pfVar9->file;
    *(err_log_callback **)((long)alStack_d0 + lVar2 + 0x40) = &pfVar9->log_callback;
    *(undefined8 *)((long)alStack_d0 + lVar2 + 0x38) = 0;
    *(uint64_t **)((long)alStack_d0 + lVar2 + 0x30) = &local_50;
    *(undefined8 *)((long)alStack_d0 + lVar2 + 0x28) = 0;
    *(undefined8 *)((long)alStack_d0 + lVar2 + 0x20) = 0x135fb9;
    filemgr_fetch_header
              (pfVar1,(uint64_t)bid,pvVar3,&seqnum,&magic,&hdr_len,
               *(uint64_t **)((long)alStack_d0 + lVar2 + 0x28),
               *(uint64_t **)((long)alStack_d0 + lVar2 + 0x30),
               *(uint64_t **)((long)alStack_d0 + lVar2 + 0x38),
               *(err_log_callback **)((long)alStack_d0 + lVar2 + 0x40));
  }
LAB_00135fd0:
  sVar11.bid = (bid_t)new_filename;
  sVar11.revnum = hdr_len;
  return sVar11;
}

Assistant:

stale_header_info fdb_get_smallest_active_header(fdb_kvs_handle *handle)
{
    uint8_t *hdr_buf = alca(uint8_t, handle->config.blocksize);
    size_t i, hdr_len;
    uint64_t n_headers;
    bid_t hdr_bid, last_wal_bid;
    filemgr_header_revnum_t hdr_revnum;
    filemgr_header_revnum_t cur_revnum;
    filemgr_magic_t magic;
    fdb_seqnum_t seqnum;
    fdb_file_handle *fhandle = NULL;
    stale_header_info ret;
    struct avl_node *a;
    struct filemgr_fhandle_idx_node *fhandle_node;
    struct list_elem *e;
    struct kvs_opened_node *item;

    ret.revnum = cur_revnum = handle->fhandle->root->cur_header_revnum;
    ret.bid = handle->fhandle->root->last_hdr_bid;

    spin_lock(&handle->file->fhandle_idx_lock);

    // check all opened file handles
    a = avl_first(&handle->file->fhandle_idx);
    while (a) {
        fhandle_node = _get_entry(a, struct filemgr_fhandle_idx_node, avl);
        a = avl_next(a);

        fhandle = (fdb_file_handle*)fhandle_node->fhandle;
        spin_lock(&fhandle->lock);
        // check all opened KVS handles belonging to the file handle
        e = list_begin(fhandle->handles);
        while (e) {

            item = _get_entry(e, struct kvs_opened_node, le);
            e = list_next(e);

            if (!item->handle->shandle) {
                // Only consider active snapshot handles since non-snapshot
                // handles will get synced upon their next forestdb api call.
                // This prevents "lazy" non-snapshot handles from holding up
                // stale block reclaim.
                continue;
            }

            if (item->handle->cur_header_revnum < ret.revnum) {
                ret.revnum = item->handle->cur_header_revnum;
                ret.bid = item->handle->last_hdr_bid;
            }
        }
        spin_unlock(&fhandle->lock);
    }

    spin_unlock(&handle->file->fhandle_idx_lock);

    uint64_t num_keeping_headers =
        atomic_get_uint64_t(&handle->file->config->num_keeping_headers,
                            std::memory_order_relaxed);
    if (num_keeping_headers) {
        // backward scan previous header info to keep more headers

        if (ret.bid == handle->last_hdr_bid) {
            // header in 'handle->last_hdr_bid' is not written into file yet!
            // we should start from the previous header
            hdr_bid = atomic_get_uint64_t(&handle->file->header.bid);
            hdr_revnum = handle->file->header.revnum - 1;
        } else {
            hdr_bid = ret.bid;
            hdr_revnum = ret.revnum;
        }

        n_headers= num_keeping_headers;
        if (cur_revnum - hdr_revnum < n_headers) {
            n_headers = n_headers - (cur_revnum - hdr_revnum);
        } else {
            n_headers = 0;
        }

        for (i=0; i<n_headers; ++i) {
            hdr_bid = filemgr_fetch_prev_header(handle->file, hdr_bid,
                         hdr_buf, &hdr_len, &seqnum, &hdr_revnum, NULL,
                         &magic, NULL, &handle->log_callback);
            if (hdr_len) {
                ret.revnum = hdr_revnum;
                ret.bid = hdr_bid;
            } else {
                break;
            }
        }
        if (!n_headers) {
            ret.bid = hdr_bid;
            ret.revnum = hdr_revnum;
        }
    }

    // although we keep more headers from the oldest active header, we have to
    // preserve the last WAL flushing header from the target header for data
    // consistency.
    uint64_t dummy64;
    char *new_filename;

    if (ret.bid == handle->last_hdr_bid) {
        // The latest header (that is not written yet) is the
        // only one that we can reclaim. Read from memory.
        filemgr_get_header(handle->file, hdr_buf, &hdr_len, NULL, &seqnum, &hdr_revnum);
        if (!hdr_len) {
            ret.bid = BLK_NOT_FOUND;
            ret.revnum = 0;
            return ret;
        }
    } else {
        filemgr_fetch_header(handle->file, ret.bid, hdr_buf, &hdr_len, &seqnum,
                             &hdr_revnum, NULL, &magic, NULL, &handle->log_callback);
    }
    fdb_fetch_header(magic, hdr_buf, &dummy64, &dummy64, &dummy64, &dummy64,
                     &dummy64, &dummy64, &dummy64, &last_wal_bid, &dummy64,
                     &dummy64, &new_filename, NULL);

    if (last_wal_bid != BLK_NOT_FOUND) {
        filemgr_fetch_header(handle->file, last_wal_bid, hdr_buf, &hdr_len, &seqnum,
                             &hdr_revnum, NULL, &magic, NULL, &handle->log_callback);
        ret.bid = last_wal_bid;
        ret.revnum = hdr_revnum;
    } else {
        // WAL has not been flushed yet .. we cannot trigger block reusing
        ret.bid = BLK_NOT_FOUND;
        ret.revnum = 0;
    }

    return ret;
}